

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mio.c
# Opt level: O1

int Mio_UpdateGenlib2(Vec_Str_t *vStr,Vec_Str_t *vStr2,char *pFileName,int fVerbose)

{
  Mio_Library_t *pLib;
  void *pvVar1;
  Map_SuperLib_t *p;
  Mio_Library_t *pLib_00;
  Amap_Lib_t *pLib_01;
  Amap_Lib_t *p_00;
  int iVar2;
  
  iVar2 = 0;
  pLib = Mio_LibraryRead(pFileName,vStr->pArray,(char *)0x0,fVerbose);
  if (pLib != (Mio_Library_t *)0x0) {
    iVar2 = 0;
    pvVar1 = Abc_FrameReadLibSuper();
    if (pvVar1 != (void *)0x0) {
      p = (Map_SuperLib_t *)Abc_FrameReadLibSuper();
      Map_SuperLibFree(p);
      Abc_FrameSetLibSuper((void *)0x0);
    }
    pLib_00 = (Mio_Library_t *)Abc_FrameReadLibGen();
    Mio_LibraryDelete(pLib_00);
    Abc_FrameSetLibGen(pLib);
    pLib_01 = Amap_LibReadAndPrepare(pFileName,vStr2->pArray,0,0);
    if (pLib_01 != (Amap_Lib_t *)0x0) {
      p_00 = (Amap_Lib_t *)Abc_FrameReadLibGen2();
      Amap_LibFree(p_00);
      Abc_FrameSetLibGen2(pLib_01);
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int Mio_UpdateGenlib2( Vec_Str_t * vStr, Vec_Str_t * vStr2, char * pFileName, int fVerbose )
{
    Mio_Library_t * pLib;
    // set the new network
    pLib = Mio_LibraryRead( pFileName, Vec_StrArray(vStr), NULL, fVerbose );  
    if ( pLib == NULL )
        return 0;

    // free the current superlib because it depends on the old Mio library
    if ( Abc_FrameReadLibSuper() )
    {
        Map_SuperLibFree( (Map_SuperLib_t *)Abc_FrameReadLibSuper() );
        Abc_FrameSetLibSuper( NULL );
    }

    // replace the current library
    Mio_LibraryDelete( (Mio_Library_t *)Abc_FrameReadLibGen() );
    Abc_FrameSetLibGen( pLib );

    // set the new network
    pLib = (Mio_Library_t *)Amap_LibReadAndPrepare( pFileName, Vec_StrArray(vStr2), 0, 0 );  
    if ( pLib == NULL )
        return 0;

    // replace the current library
    Amap_LibFree( (Amap_Lib_t *)Abc_FrameReadLibGen2() );
    Abc_FrameSetLibGen2( pLib );
    return 1;
}